

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::TcParseFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,TcParseFunction func)

{
  Nonnull<const_char_*> failure_msg;
  ulong uVar1;
  int line;
  uint v1;
  LogMessage local_70 [3];
  AlphaNum local_40;
  
  v1 = (uint)this;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(v1,0,"func_index >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_40.piece_._M_len = CONCAT44(local_40.piece_._M_len._4_4_,v1);
    local_70[0].errno_saver_.saved_errno_ = 0x7c;
    local_70[0]._4_4_ = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_LTImpl<int,long>
                            ((int *)&local_40,(long *)local_70,
                             "func_index < std::end(kNames) - std::begin(kNames)");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_70[0].errno_saver_.saved_errno_ = 0x12;
      local_70[0]._4_4_ = 0;
      local_70[0].data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        )0x4ec142;
      uVar1 = (ulong)((v1 & 0xff) << 4);
      local_40.piece_._M_len = *(size_t *)((long)&TcParseFunctionName::kNames[0]._M_len + uVar1);
      local_40.piece_._M_str = *(char **)((long)&TcParseFunctionName::kNames[0]._M_str + uVar1);
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)local_70,&local_40,
                 (AlphaNum *)TcParseFunctionName::kNames);
      return __return_storage_ptr__;
    }
    line = 0x10e;
  }
  else {
    line = 0x10d;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_70);
}

Assistant:

static std::string TcParseFunctionName(internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) #value,
  static constexpr absl::string_view kNames[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int func_index = static_cast<int>(func);
  ABSL_CHECK_GE(func_index, 0);
  ABSL_CHECK_LT(func_index, std::end(kNames) - std::begin(kNames));
  static constexpr absl::string_view ns = "::_pbi::TcParser::";
  return absl::StrCat(ns, kNames[func_index]);
}